

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_TagBox.cpp
# Opt level: O0

void __thiscall amrex::TagBox::tags(TagBox *this,Vector<int,_std::allocator<int>_> *ar,Box *tilebx)

{
  long lVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  Box *in_RDX;
  BaseFab<char> *in_RDI;
  IntVect IVar5;
  int i;
  TagType *cptr;
  int j;
  int k;
  int *iptr;
  TagType *p0;
  int idim_1;
  int Ltb [3];
  Long stb;
  Long stride [3];
  int idim;
  int Lbx [3];
  IntVect dlen;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  char *local_b0;
  int local_a8;
  int local_a4;
  int *local_a0;
  int local_90;
  int local_8c [3];
  long local_80;
  long local_78 [4];
  int local_58;
  int local_54 [3];
  int local_48 [3];
  undefined8 local_34;
  int local_2c;
  Box *local_28;
  int local_c;
  undefined8 *local_8;
  
  local_28 = in_RDX;
  IVar5 = BaseFab<char>::length(in_RDI);
  local_48._0_8_ = IVar5.vect._0_8_;
  local_34._0_4_ = local_48[0];
  local_34._4_4_ = local_48[1];
  local_48[2] = IVar5.vect[2];
  local_2c = local_48[2];
  local_54[0] = 1;
  local_54[1] = 1;
  local_54[2] = 1;
  for (local_58 = 0; local_58 < 3; local_58 = local_58 + 1) {
    local_8 = &local_34;
    local_c = local_58;
    local_54[local_58] = *(int *)((long)local_8 + (long)local_58 * 4);
  }
  local_78[0] = 1;
  local_78[1] = (long)local_54[0];
  local_78[2] = (long)local_54[0] * (long)local_54[1];
  local_80 = 0;
  local_8c[0] = 1;
  local_8c[1] = 1;
  local_8c[2] = 1;
  local_48 = IVar5.vect;
  for (local_90 = 0; local_90 < 3; local_90 = local_90 + 1) {
    iVar2 = Box::length(local_28,local_90);
    local_8c[local_90] = iVar2;
    lVar1 = local_78[local_90];
    iVar2 = Box::smallEnd(local_28,local_90);
    iVar3 = Box::smallEnd(&in_RDI->domain,local_90);
    local_80 = lVar1 * (iVar2 - iVar3) + local_80;
  }
  pcVar4 = BaseFab<char>::dataPtr
                     ((BaseFab<char> *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)
                      ,(int)((ulong)in_RDI >> 0x20));
  lVar1 = local_80;
  local_a0 = Vector<int,_std::allocator<int>_>::dataPtr
                       ((Vector<int,_std::allocator<int>_> *)0x135f446);
  for (local_a4 = 0; local_a4 < local_8c[2]; local_a4 = local_a4 + 1) {
    for (local_a8 = 0; local_a8 < local_8c[1]; local_a8 = local_a8 + 1) {
      local_b0 = pcVar4 + local_a4 * local_78[2] + local_a8 * local_78[1] + lVar1;
      for (iVar2 = 0; iVar2 < local_8c[0]; iVar2 = iVar2 + 1) {
        if (*local_a0 != 0) {
          *local_b0 = (char)*local_a0;
        }
        local_b0 = local_b0 + 1;
        local_a0 = local_a0 + 1;
      }
    }
  }
  return;
}

Assistant:

void
TagBox::tags (const Vector<int>& ar, const Box& tilebx) noexcept
{
    auto dlen = length();
    int Lbx[] = {1,1,1};
    for (int idim=0; idim<AMREX_SPACEDIM; idim++) {
        Lbx[idim] = dlen[idim];
    }

    Long stride[] = {1, Lbx[0], Long(Lbx[0])*Long(Lbx[1])};

    Long stb=0;
    int Ltb[] = {1,1,1};
    for (int idim=0; idim<AMREX_SPACEDIM; idim++) {
        Ltb[idim] = tilebx.length(idim);
        stb += stride[idim] * (tilebx.smallEnd(idim) - domain.smallEnd(idim));
    }

    TagType* const p0   = dataPtr() + stb;  // +stb to the lower corner of tilebox
    const int*     iptr = ar.dataPtr();

    for (int k=0; k<Ltb[2]; k++) {
        for (int j=0; j<Ltb[1]; j++) {
            TagType* cptr = p0 + j*stride[1] + k*stride[2];
            for (int i=0; i<Ltb[0]; i++, cptr++, iptr++) {
                if (*iptr) *cptr = *iptr;
            }
        }
    }
}